

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O3

int32 hmm_vit_eval(hmm_t *hmm)

{
  uint8 uVar1;
  byte bVar2;
  hmm_context_t *phVar3;
  int16 *piVar4;
  byte *pbVar5;
  uint16 **ppuVar6;
  int32 iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ushort uVar18;
  ushort uVar19;
  
  uVar1 = hmm->n_emit_state;
  if (hmm->mpx == '\0') {
    if (uVar1 == '\x03') {
      piVar4 = hmm->ctx->senscore;
      pbVar5 = *hmm->ctx->tp[hmm->tmatid];
      iVar9 = hmm->score[2] - (int)piVar4[hmm->senid[2]];
      iVar16 = hmm->score[1] - (int)piVar4[hmm->senid[1]];
      iVar11 = hmm->score[0] - (int)piVar4[hmm->senid[0]];
      if (iVar16 < -0x1fffffff) {
        iVar14 = -0x20000000;
        iVar8 = -0x80000000;
      }
      else {
        iVar14 = iVar9 - (uint)pbVar5[0xb];
        iVar8 = -0x80000000;
        if (pbVar5[7] != 0xff) {
          iVar8 = iVar16 - (uint)pbVar5[7];
        }
        iVar13 = iVar14;
        if (iVar14 <= iVar8) {
          iVar13 = iVar8;
        }
        hmm->out_history = hmm->history[(ulong)(iVar8 < iVar14) + 1];
        iVar14 = -0x20000000;
        if (-0x20000000 < iVar13) {
          iVar14 = iVar13;
        }
        hmm->out_score = iVar14;
      }
      iVar9 = iVar9 - (uint)pbVar5[10];
      iVar10 = iVar16 - (uint)pbVar5[6];
      iVar13 = iVar11 - (uint)pbVar5[2];
      if (pbVar5[2] == 0xff) {
        iVar13 = iVar8;
      }
      if (iVar10 < iVar9) {
        if (iVar9 < iVar13) {
LAB_0012c907:
          hmm->history[2] = hmm->history[0];
          iVar9 = iVar13;
        }
      }
      else {
        if (iVar10 < iVar13) goto LAB_0012c907;
        hmm->history[2] = hmm->history[1];
        iVar9 = iVar10;
      }
      iVar8 = -0x20000000;
      if (-0x20000000 < iVar9) {
        iVar8 = iVar9;
      }
      hmm->score[2] = iVar8;
      bVar2 = pbVar5[1];
      iVar13 = iVar16 - (uint)pbVar5[5];
      if ((int)(iVar16 - (uint)pbVar5[5]) <= (int)(iVar11 - (uint)bVar2)) {
        hmm->history[1] = hmm->history[0];
        iVar13 = iVar11 - (uint)bVar2;
      }
      if (iVar9 <= iVar14) {
        iVar8 = iVar14;
      }
      iVar9 = -0x20000000;
      if (-0x20000000 < iVar13) {
        iVar9 = iVar13;
      }
      if (iVar8 < iVar13) {
        iVar8 = iVar9;
      }
      hmm->score[1] = iVar9;
      iVar11 = iVar11 - (uint)*pbVar5;
      iVar9 = -0x20000000;
      if (-0x20000000 < iVar11) {
        iVar9 = iVar11;
      }
      if (iVar8 < iVar11) {
        iVar8 = iVar9;
      }
      hmm->score[0] = iVar9;
      goto LAB_0012ce2e;
    }
    if (uVar1 != '\x05') goto LAB_0012c76c;
    piVar4 = hmm->ctx->senscore;
    pbVar5 = *hmm->ctx->tp[hmm->tmatid];
    iVar9 = hmm->score[4] - (int)piVar4[hmm->senid[4]];
    iVar11 = hmm->score[3] - (int)piVar4[hmm->senid[3]];
    iVar8 = -0x20000000;
    if (-0x20000000 < iVar11) {
      iVar8 = iVar9 - (uint)pbVar5[0x1d];
      iVar14 = iVar11 - (uint)pbVar5[0x17];
      iVar16 = iVar14;
      if (iVar14 < iVar8) {
        iVar16 = iVar8;
      }
      hmm->out_history = hmm->history[(ulong)(iVar14 < iVar8) + 3];
      iVar8 = -0x20000000;
      if (-0x20000000 < iVar16) {
        iVar8 = iVar16;
      }
      hmm->out_score = iVar8;
    }
    iVar16 = hmm->score[2] - (int)piVar4[hmm->senid[2]];
    if (-0x20000000 < iVar16) {
      iVar9 = iVar9 - (uint)pbVar5[0x1c];
      iVar13 = iVar11 - (uint)pbVar5[0x16];
      iVar14 = iVar16 - (uint)pbVar5[0x10];
      if (iVar13 < iVar9) {
        if (iVar9 < iVar14) {
LAB_0012cc43:
          hmm->history[4] = hmm->history[2];
          iVar9 = iVar14;
        }
      }
      else {
        if (iVar13 < iVar14) goto LAB_0012cc43;
        hmm->history[4] = hmm->history[3];
        iVar9 = iVar13;
      }
      iVar14 = -0x20000000;
      if (-0x20000000 < iVar9) {
        iVar14 = iVar9;
      }
      if (iVar8 < iVar9) {
        iVar8 = iVar14;
      }
      hmm->score[4] = iVar14;
    }
    iVar9 = hmm->score[1] - (int)piVar4[hmm->senid[1]];
    if (-0x20000000 < iVar9) {
      iVar11 = iVar11 - (uint)pbVar5[0x15];
      iVar13 = iVar16 - (uint)pbVar5[0xf];
      iVar14 = iVar9 - (uint)pbVar5[9];
      if (iVar13 < iVar11) {
        if (iVar11 < iVar14) {
LAB_0012cd43:
          hmm->history[3] = hmm->history[1];
          iVar11 = iVar14;
        }
      }
      else {
        if (iVar13 < iVar14) goto LAB_0012cd43;
        hmm->history[3] = hmm->history[2];
        iVar11 = iVar13;
      }
      iVar14 = -0x20000000;
      if (-0x20000000 < iVar11) {
        iVar14 = iVar11;
      }
      if (iVar8 < iVar11) {
        iVar8 = iVar14;
      }
      hmm->score[3] = iVar14;
    }
    iVar14 = hmm->score[0] - (int)piVar4[hmm->senid[0]];
    iVar16 = iVar16 - (uint)pbVar5[0xe];
    iVar13 = iVar9 - (uint)pbVar5[8];
    iVar11 = iVar14 - (uint)pbVar5[2];
    if (iVar13 < iVar16) {
      if (iVar16 < iVar11) {
LAB_0012cdb3:
        hmm->history[2] = hmm->history[0];
        iVar16 = iVar11;
      }
    }
    else {
      if (iVar13 < iVar11) goto LAB_0012cdb3;
      hmm->history[2] = hmm->history[1];
      iVar16 = iVar13;
    }
    if (iVar16 < -0x1fffffff) {
      iVar16 = -0x20000000;
    }
    hmm->score[2] = iVar16;
    bVar2 = pbVar5[1];
    iVar11 = iVar9 - (uint)pbVar5[7];
    if ((int)(iVar9 - (uint)pbVar5[7]) <= (int)(iVar14 - (uint)bVar2)) {
      hmm->history[1] = hmm->history[0];
      iVar11 = iVar14 - (uint)bVar2;
    }
    if (iVar8 < iVar16) {
      iVar8 = iVar16;
    }
    if (iVar11 < -0x1fffffff) {
      iVar11 = -0x20000000;
    }
    if (iVar8 < iVar11) {
      iVar8 = iVar11;
    }
    hmm->score[1] = iVar11;
    iVar14 = iVar14 - (uint)*pbVar5;
    if (iVar14 < -0x1fffffff) {
      iVar14 = -0x20000000;
    }
    if (iVar8 < iVar14) {
      iVar8 = iVar14;
    }
    hmm->score[0] = iVar14;
    goto LAB_0012ce2e;
  }
  if (uVar1 == '\x03') {
    phVar3 = hmm->ctx;
    piVar4 = phVar3->senscore;
    pbVar5 = *phVar3->tp[hmm->tmatid];
    ppuVar6 = phVar3->sseq;
    iVar11 = -0x20000000;
    iVar16 = -0x20000000;
    iVar9 = -0x20000000;
    if ((ulong)hmm->senid[2] != 0xffff) {
      iVar16 = hmm->score[2] - (int)piVar4[ppuVar6[hmm->senid[2]][2]];
      iVar9 = iVar16 - (uint)pbVar5[0xb];
    }
    uVar19 = hmm->senid[1];
    iVar8 = -0x20000000;
    if ((ulong)uVar19 != 0xffff) {
      iVar11 = hmm->score[1] - (int)piVar4[ppuVar6[uVar19][1]];
      if (pbVar5[7] == 0xff) {
        iVar8 = -0x80000000;
      }
      else {
        iVar8 = iVar11 - (uint)pbVar5[7];
      }
    }
    iVar14 = iVar9;
    if (iVar9 <= iVar8) {
      iVar14 = iVar8;
    }
    hmm->out_history = hmm->history[(ulong)(iVar8 < iVar9) + 1];
    iVar9 = -0x20000000;
    if (iVar14 < -0x1fffffff) {
      iVar14 = -0x20000000;
    }
    hmm->out_score = iVar14;
    uVar18 = hmm->senid[0];
    iVar13 = -0x20000000;
    if (iVar16 != -0x20000000) {
      iVar13 = iVar16 - (uint)pbVar5[10];
    }
    iVar16 = hmm->score[0] - (int)piVar4[*ppuVar6[uVar18]];
    if (iVar11 != -0x20000000) {
      iVar9 = iVar11 - (uint)pbVar5[6];
    }
    iVar10 = iVar16 - (uint)pbVar5[2];
    if (pbVar5[2] == 0xff) {
      iVar10 = iVar8;
    }
    if (iVar9 < iVar13) {
      if (iVar13 < iVar10) {
LAB_0012cb93:
        hmm->history[2] = hmm->history[0];
        iVar13 = iVar10;
        uVar19 = uVar18;
        goto LAB_0012cba9;
      }
    }
    else {
      if (iVar9 < iVar10) goto LAB_0012cb93;
      hmm->history[2] = hmm->history[1];
      iVar13 = iVar9;
LAB_0012cba9:
      hmm->senid[2] = uVar19;
    }
    iVar9 = -0x20000000;
    iVar8 = -0x20000000;
    if (-0x20000000 < iVar13) {
      iVar8 = iVar13;
    }
    hmm->score[2] = iVar8;
    if (iVar11 != -0x20000000) {
      iVar9 = iVar11 - (uint)pbVar5[5];
    }
    bVar2 = pbVar5[1];
    if (iVar9 <= (int)(iVar16 - (uint)bVar2)) {
      hmm->history[1] = hmm->history[0];
      hmm->senid[1] = uVar18;
      iVar9 = iVar16 - (uint)bVar2;
    }
    if (iVar13 <= iVar14) {
      iVar8 = iVar14;
    }
    iVar11 = -0x20000000;
    if (-0x20000000 < iVar9) {
      iVar11 = iVar9;
    }
    if (iVar8 < iVar9) {
      iVar8 = iVar11;
    }
    hmm->score[1] = iVar11;
    iVar16 = iVar16 - (uint)*pbVar5;
    iVar9 = -0x20000000;
    if (-0x20000000 < iVar16) {
      iVar9 = iVar16;
    }
    if (iVar8 < iVar16) {
      iVar8 = iVar9;
    }
    hmm->score[0] = iVar9;
    goto LAB_0012ce2e;
  }
  if (uVar1 != '\x05') {
LAB_0012c76c:
    iVar7 = hmm_vit_eval_anytopo(hmm);
    return iVar7;
  }
  phVar3 = hmm->ctx;
  piVar4 = phVar3->senscore;
  pbVar5 = *phVar3->tp[hmm->tmatid];
  ppuVar6 = phVar3->sseq;
  iVar16 = -0x20000000;
  iVar9 = -0x20000000;
  iVar11 = -0x20000000;
  if ((ulong)hmm->senid[4] != 0xffff) {
    iVar9 = hmm->score[4] - (int)piVar4[ppuVar6[hmm->senid[4]][4]];
    iVar11 = iVar9 - (uint)pbVar5[0x1d];
  }
  uVar19 = hmm->senid[3];
  iVar8 = -0x20000000;
  if ((ulong)uVar19 != 0xffff) {
    iVar16 = hmm->score[3] - (int)piVar4[ppuVar6[uVar19][3]];
    iVar8 = iVar16 - (uint)pbVar5[0x17];
  }
  iVar14 = iVar8;
  if (iVar8 < iVar11) {
    iVar14 = iVar11;
  }
  hmm->out_history = hmm->history[(ulong)(iVar8 < iVar11) + 3];
  iVar11 = -0x20000000;
  if (iVar14 < -0x1fffffff) {
    iVar14 = -0x20000000;
  }
  hmm->out_score = iVar14;
  uVar18 = hmm->senid[2];
  iVar13 = -0x20000000;
  iVar8 = -0x20000000;
  if ((ulong)uVar18 != 0xffff) {
    iVar13 = hmm->score[2] - (int)piVar4[ppuVar6[uVar18][2]];
    iVar8 = iVar13 - (uint)pbVar5[0x10];
  }
  if (iVar9 != -0x20000000) {
    iVar11 = iVar9 - (uint)pbVar5[0x1c];
  }
  iVar9 = -0x20000000;
  if (iVar16 != -0x20000000) {
    iVar9 = iVar16 - (uint)pbVar5[0x16];
  }
  if (iVar9 < iVar11) {
    if (iVar11 < iVar8) {
LAB_0012c8b2:
      hmm->history[4] = hmm->history[2];
      iVar9 = iVar8;
      uVar19 = uVar18;
      goto LAB_0012c91d;
    }
  }
  else {
    if (iVar9 < iVar8) goto LAB_0012c8b2;
    hmm->history[4] = hmm->history[3];
LAB_0012c91d:
    hmm->senid[4] = uVar19;
    iVar11 = iVar9;
  }
  iVar9 = -0x20000000;
  iVar8 = -0x20000000;
  if (-0x20000000 < iVar11) {
    iVar8 = iVar11;
  }
  hmm->score[4] = iVar8;
  uVar19 = hmm->senid[1];
  iVar10 = -0x20000000;
  iVar17 = -0x20000000;
  if ((ulong)uVar19 != 0xffff) {
    iVar10 = hmm->score[1] - (int)piVar4[ppuVar6[uVar19][1]];
    iVar17 = iVar10 - (uint)pbVar5[9];
  }
  if (iVar16 != -0x20000000) {
    iVar9 = iVar16 - (uint)pbVar5[0x15];
  }
  iVar16 = -0x20000000;
  if (iVar13 != -0x20000000) {
    iVar16 = iVar13 - (uint)pbVar5[0xf];
  }
  if (iVar16 < iVar9) {
    if (iVar9 < iVar17) {
LAB_0012c9b0:
      hmm->history[3] = hmm->history[1];
      iVar16 = iVar17;
      uVar18 = uVar19;
      goto LAB_0012c9c6;
    }
  }
  else {
    if (iVar16 < iVar17) goto LAB_0012c9b0;
    hmm->history[3] = hmm->history[2];
LAB_0012c9c6:
    hmm->senid[3] = uVar18;
    iVar9 = iVar16;
  }
  iVar17 = -0x20000000;
  iVar16 = -0x20000000;
  if (-0x20000000 < iVar9) {
    iVar16 = iVar9;
  }
  hmm->score[3] = iVar16;
  uVar18 = hmm->senid[0];
  iVar15 = -0x20000000;
  if (iVar13 != -0x20000000) {
    iVar15 = iVar13 - (uint)pbVar5[0xe];
  }
  iVar13 = hmm->score[0] - (int)piVar4[*ppuVar6[uVar18]];
  if (iVar10 != -0x20000000) {
    iVar17 = iVar10 - (uint)pbVar5[8];
  }
  iVar12 = iVar13 - (uint)pbVar5[2];
  if (iVar17 < iVar15) {
    if (iVar15 < iVar12) {
LAB_0012ca46:
      hmm->history[2] = hmm->history[0];
      iVar15 = iVar12;
      uVar19 = uVar18;
      goto LAB_0012ca5e;
    }
  }
  else {
    if (iVar17 < iVar12) goto LAB_0012ca46;
    hmm->history[2] = hmm->history[1];
    iVar15 = iVar17;
LAB_0012ca5e:
    hmm->senid[2] = uVar19;
  }
  iVar12 = -0x20000000;
  iVar17 = -0x20000000;
  if (-0x20000000 < iVar15) {
    iVar17 = iVar15;
  }
  hmm->score[2] = iVar17;
  if (iVar10 != -0x20000000) {
    iVar12 = iVar10 - (uint)pbVar5[7];
  }
  bVar2 = pbVar5[1];
  if (iVar12 <= (int)(iVar13 - (uint)bVar2)) {
    hmm->history[1] = hmm->history[0];
    hmm->senid[1] = uVar18;
    iVar12 = iVar13 - (uint)bVar2;
  }
  if (iVar11 <= iVar14) {
    iVar8 = iVar14;
  }
  if (iVar8 < iVar9) {
    iVar8 = iVar16;
  }
  if (iVar8 < iVar15) {
    iVar8 = iVar17;
  }
  iVar9 = -0x20000000;
  if (-0x20000000 < iVar12) {
    iVar9 = iVar12;
  }
  if (iVar8 < iVar12) {
    iVar8 = iVar9;
  }
  hmm->score[1] = iVar9;
  iVar13 = iVar13 - (uint)*pbVar5;
  if (iVar13 < -0x1fffffff) {
    iVar13 = -0x20000000;
  }
  if (iVar8 < iVar13) {
    iVar8 = iVar13;
  }
  hmm->score[0] = iVar13;
LAB_0012ce2e:
  hmm->bestscore = iVar8;
  return iVar8;
}

Assistant:

int32
hmm_vit_eval(hmm_t * hmm)
{
    if (hmm_is_mpx(hmm)) {
        if (hmm_n_emit_state(hmm) == 5)
            return hmm_vit_eval_5st_lr_mpx(hmm);
        else if (hmm_n_emit_state(hmm) == 3)
            return hmm_vit_eval_3st_lr_mpx(hmm);
        else
            return hmm_vit_eval_anytopo(hmm);
    }
    else {
        if (hmm_n_emit_state(hmm) == 5)
            return hmm_vit_eval_5st_lr(hmm);
        else if (hmm_n_emit_state(hmm) == 3)
            return hmm_vit_eval_3st_lr(hmm);
        else
            return hmm_vit_eval_anytopo(hmm);
    }
}